

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm.cpp
# Opt level: O1

int __thiscall ncnn::LayerNorm::forward_inplace(LayerNorm *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  void *pvVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  iVar1 = bottom_top_blob->dims;
  if (iVar1 == 3) {
    uVar2 = bottom_top_blob->w;
    uVar11 = (ulong)uVar2;
    uVar9 = bottom_top_blob->h;
    uVar4 = bottom_top_blob->c;
    if (this->affine_size == uVar2) {
      if (0 < (int)uVar4) {
        iVar1 = bottom_top_blob->w;
        pvVar13 = bottom_top_blob->data;
        sVar7 = bottom_top_blob->elemsize;
        iVar3 = this->affine;
        sVar8 = bottom_top_blob->cstep;
        uVar14 = 0;
        do {
          if (0 < (int)uVar9) {
            pvVar5 = (this->gamma_data).data;
            pvVar6 = (this->beta_data).data;
            uVar15 = 0;
            pvVar17 = pvVar13;
            do {
              fVar19 = 0.0;
              fVar18 = 0.0;
              if (0 < (int)uVar2) {
                uVar16 = 0;
                do {
                  fVar18 = fVar18 + *(float *)((long)pvVar17 + uVar16 * 4);
                  uVar16 = uVar16 + 1;
                } while (uVar11 != uVar16);
              }
              fVar18 = fVar18 * (1.0 / (float)(int)uVar2);
              if (0 < (int)uVar2) {
                fVar19 = 0.0;
                uVar16 = 0;
                do {
                  fVar20 = *(float *)((long)pvVar17 + uVar16 * 4) - fVar18;
                  fVar19 = fVar19 + fVar20 * fVar20;
                  uVar16 = uVar16 + 1;
                } while (uVar11 != uVar16);
              }
              fVar19 = 1.0 / SQRT(fVar19 * (1.0 / (float)(int)uVar2) + this->eps);
              fVar18 = -fVar18 * fVar19;
              if (iVar3 == 0) {
                if (0 < (int)uVar2) {
                  uVar16 = 0;
                  do {
                    *(float *)((long)pvVar17 + uVar16 * 4) =
                         *(float *)((long)pvVar17 + uVar16 * 4) * fVar19 + fVar18;
                    uVar16 = uVar16 + 1;
                  } while (uVar11 != uVar16);
                }
              }
              else if (0 < (int)uVar2) {
                uVar16 = 0;
                do {
                  *(float *)((long)pvVar17 + uVar16 * 4) =
                       (*(float *)((long)pvVar17 + uVar16 * 4) * fVar19 + fVar18) *
                       *(float *)((long)pvVar5 + uVar16 * 4) + *(float *)((long)pvVar6 + uVar16 * 4)
                  ;
                  uVar16 = uVar16 + 1;
                } while (uVar11 != uVar16);
              }
              uVar15 = uVar15 + 1;
              pvVar17 = (void *)((long)pvVar17 + (long)iVar1 * sVar7);
            } while (uVar15 != uVar9);
          }
          uVar14 = uVar14 + 1;
          pvVar13 = (void *)((long)pvVar13 + sVar8 * sVar7);
        } while (uVar14 != uVar4);
      }
    }
    else if (0 < (int)uVar4) {
      uVar9 = uVar9 * uVar2;
      pvVar13 = bottom_top_blob->data;
      sVar7 = bottom_top_blob->cstep;
      iVar1 = this->affine;
      pvVar5 = (this->gamma_data).data;
      pvVar6 = (this->beta_data).data;
      uVar11 = (ulong)uVar9;
      sVar8 = bottom_top_blob->elemsize;
      uVar14 = 0;
      do {
        fVar19 = 0.0;
        fVar18 = 0.0;
        if (0 < (int)uVar9) {
          uVar15 = 0;
          do {
            fVar18 = fVar18 + *(float *)((long)pvVar13 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        fVar18 = fVar18 * (1.0 / (float)(int)uVar9);
        if (0 < (int)uVar9) {
          fVar19 = 0.0;
          uVar15 = 0;
          do {
            fVar20 = *(float *)((long)pvVar13 + uVar15 * 4) - fVar18;
            fVar19 = fVar19 + fVar20 * fVar20;
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        fVar19 = 1.0 / SQRT(fVar19 * (1.0 / (float)(int)uVar9) + this->eps);
        fVar18 = -fVar18 * fVar19;
        if (iVar1 == 0) {
          if (0 < (int)uVar9) {
            uVar15 = 0;
            do {
              *(float *)((long)pvVar13 + uVar15 * 4) =
                   *(float *)((long)pvVar13 + uVar15 * 4) * fVar19 + fVar18;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
        }
        else if (0 < (int)uVar9) {
          uVar15 = 0;
          do {
            *(float *)((long)pvVar13 + uVar15 * 4) =
                 (*(float *)((long)pvVar13 + uVar15 * 4) * fVar19 + fVar18) *
                 *(float *)((long)pvVar5 + uVar15 * 4) + *(float *)((long)pvVar6 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        uVar14 = uVar14 + 1;
        pvVar13 = (void *)((long)pvVar13 + sVar7 * sVar8);
      } while (uVar14 != uVar4);
    }
  }
  else if (iVar1 == 2) {
    iVar1 = bottom_top_blob->h;
    if (0 < (long)iVar1) {
      uVar2 = bottom_top_blob->w;
      pvVar13 = bottom_top_blob->data;
      iVar3 = this->affine;
      pvVar5 = (this->gamma_data).data;
      pvVar6 = (this->beta_data).data;
      uVar11 = (ulong)uVar2;
      sVar7 = bottom_top_blob->elemsize;
      lVar10 = 0;
      do {
        fVar19 = 0.0;
        fVar18 = 0.0;
        if (0 < (int)uVar2) {
          uVar14 = 0;
          do {
            fVar18 = fVar18 + *(float *)((long)pvVar13 + uVar14 * 4);
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        fVar18 = fVar18 * (1.0 / (float)(int)uVar2);
        if (0 < (int)uVar2) {
          fVar19 = 0.0;
          uVar14 = 0;
          do {
            fVar20 = *(float *)((long)pvVar13 + uVar14 * 4) - fVar18;
            fVar19 = fVar19 + fVar20 * fVar20;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        fVar19 = 1.0 / SQRT(fVar19 * (1.0 / (float)(int)uVar2) + this->eps);
        fVar18 = -fVar18 * fVar19;
        if (iVar3 == 0) {
          if (0 < (int)uVar2) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar13 + uVar14 * 4) =
                   *(float *)((long)pvVar13 + uVar14 * 4) * fVar19 + fVar18;
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
          }
        }
        else if (0 < (int)uVar2) {
          uVar14 = 0;
          do {
            *(float *)((long)pvVar13 + uVar14 * 4) =
                 (*(float *)((long)pvVar13 + uVar14 * 4) * fVar19 + fVar18) *
                 *(float *)((long)pvVar5 + uVar14 * 4) + *(float *)((long)pvVar6 + uVar14 * 4);
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
        lVar10 = lVar10 + 1;
        pvVar13 = (void *)((long)pvVar13 + (long)(int)uVar2 * sVar7);
      } while (lVar10 != iVar1);
    }
  }
  else if (iVar1 == 1) {
    iVar1 = bottom_top_blob->w;
    lVar10 = (long)iVar1;
    pvVar13 = bottom_top_blob->data;
    fVar19 = 0.0;
    fVar18 = 0.0;
    if (0 < lVar10) {
      lVar12 = 0;
      do {
        fVar18 = fVar18 + *(float *)((long)pvVar13 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    fVar18 = fVar18 / (float)iVar1;
    if (0 < iVar1) {
      fVar19 = 0.0;
      lVar12 = 0;
      do {
        fVar20 = *(float *)((long)pvVar13 + lVar12 * 4) - fVar18;
        fVar19 = fVar19 + fVar20 * fVar20;
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
    fVar19 = 1.0 / SQRT(fVar19 / (float)iVar1 + this->eps);
    fVar18 = -fVar18 * fVar19;
    if (this->affine == 0) {
      if (0 < iVar1) {
        lVar12 = 0;
        do {
          *(float *)((long)pvVar13 + lVar12 * 4) =
               *(float *)((long)pvVar13 + lVar12 * 4) * fVar19 + fVar18;
          lVar12 = lVar12 + 1;
        } while (lVar10 != lVar12);
      }
    }
    else if (0 < iVar1) {
      pvVar5 = (this->gamma_data).data;
      pvVar6 = (this->beta_data).data;
      lVar12 = 0;
      do {
        *(float *)((long)pvVar13 + lVar12 * 4) =
             (*(float *)((long)pvVar13 + lVar12 * 4) * fVar19 + fVar18) *
             *(float *)((long)pvVar5 + lVar12 * 4) + *(float *)((long)pvVar6 + lVar12 * 4);
        lVar12 = lVar12 + 1;
      } while (lVar10 != lVar12);
    }
  }
  return 0;
}

Assistant:

int LayerNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / sqrt(var + eps) * gamma + beta

    int dims = bottom_top_blob.dims;

    if (dims == 1)
    {
        int w = bottom_top_blob.w;
        // assert affine_size == w

        float* ptr = bottom_top_blob;

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i = 0; i < w; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / w;
        float tmp = 0.f;
        for (int i = 0; i < w; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / w;
        // the var maybe minus due to accuracy
        //float var = sqsum / w - mean * mean;

        float a = 1.f / (sqrtf(var + eps));
        float b = -mean * a;

        if (affine)
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
            }
        }
        else
        {
            for (int i = 0; i < w; i++)
            {
                ptr[i] = ptr[i] * a + b;
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        // assert affine_size == w

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);

            // mean and var
            float sum = 0.f;
            float sqsum = 0.f;
            for (int j = 0; j < w; j++)
            {
                sum += ptr[j];
                //sqsum += ptr[j] * ptr[j];
            }
            float mean = sum / w;
            float tmp = 0.f;
            for (int j = 0; j < w; j++)
            {
                tmp = ptr[j] - mean;
                sqsum += tmp * tmp;
            }
            float var = sqsum / w;
            // the var maybe minus due to accuracy
            //float var = sqsum / w - mean * mean;

            float a = 1.f / (sqrtf(var + eps));
            float b = -mean * a;

            if (affine)
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                }
            }
            else
            {
                for (int j = 0; j < w; j++)
                {
                    ptr[j] = ptr[j] * a + b;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);

                    // mean and var
                    float sum = 0.f;
                    float sqsum = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        sum += ptr[j];
                        //sqsum += ptr[j] * ptr[j];
                    }
                    float mean = sum / w;
                    float tmp = 0.f;
                    for (int j = 0; j < w; j++)
                    {
                        tmp = ptr[j] - mean;
                        sqsum += tmp * tmp;
                    }
                    float var = sqsum / w;
                    // the var maybe minus due to accuracy
                    //float var = sqsum / w - mean * mean;

                    float a = 1.f / (sqrtf(var + eps));
                    float b = -mean * a;

                    if (affine)
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = (ptr[j] * a + b) * gamma_data[j] + beta_data[j];
                        }
                    }
                    else
                    {
                        for (int j = 0; j < w; j++)
                        {
                            ptr[j] = ptr[j] * a + b;
                        }
                    }
                }
            }
        }
        else // if (affine_size == size)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                // mean and var
                float sum = 0.f;
                float sqsum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                    //sqsum += ptr[i] * ptr[i];
                }
                float mean = sum / size;
                float tmp = 0.f;
                for (int i = 0; i < size; i++)
                {
                    tmp = ptr[i] - mean;
                    sqsum += tmp * tmp;
                }
                float var = sqsum / size;
                // the var maybe minus due to accuracy
                //float var = sqsum / size - mean * mean;

                float a = 1.f / (sqrtf(var + eps));
                float b = -mean * a;

                if (affine)
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = (ptr[i] * a + b) * gamma_data[i] + beta_data[i];
                    }
                }
                else
                {
                    for (int i = 0; i < size; i++)
                    {
                        ptr[i] = ptr[i] * a + b;
                    }
                }
            }
        }
    }

    return 0;
}